

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

bool __thiscall
cmComputeLinkInformation::CheckSharedLibNoSOName(cmComputeLinkInformation *this,LinkEntry *entry)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  string soname;
  string file;
  string local_60;
  string local_40;
  
  cmsys::SystemTools::GetFilenameName(&local_40,(string *)entry);
  bVar2 = cmsys::RegularExpression::find
                    (&this->ExtractSharedLibraryName,local_40._M_dataplus._M_p,
                     &(this->ExtractSharedLibraryName).regmatch);
  if (bVar2) {
    paVar1 = &local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = cmSystemTools::GuessLibrarySOName((string *)entry,&local_60);
    if (bVar2) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      AddSharedLibNoSOName(this,entry);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      bVar3 = true;
      if (!bVar2) goto LAB_00444d33;
    }
  }
  bVar3 = false;
LAB_00444d33:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmComputeLinkInformation::CheckSharedLibNoSOName(LinkEntry const& entry)
{
  // This platform will use the path to a library as its soname if the
  // library is given via path and was not built with an soname.  If
  // this is a shared library that might be the case.
  std::string file = cmSystemTools::GetFilenameName(entry.Item.Value);
  if (this->ExtractSharedLibraryName.find(file)) {
    // If we can guess the soname fairly reliably then assume the
    // library has one.  Otherwise assume the library has no builtin
    // soname.
    std::string soname;
    if (!cmSystemTools::GuessLibrarySOName(entry.Item.Value, soname)) {
      this->AddSharedLibNoSOName(entry);
      return true;
    }
  }
  return false;
}